

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O2

ON_wString __thiscall
ON_FileSystemPath::RemoveFileName(ON_FileSystemPath *this,wchar_t *path,ON_wString *file_name)

{
  int length;
  wchar_t *path_00;
  ON_wString local_path;
  wchar_t *fname;
  wchar_t *dir;
  wchar_t *vol;
  ON_wString local_40;
  wchar_t *local_38;
  wchar_t *local_30;
  wchar_t *local_28;
  
  CleanPath((ON_FileSystemPath *)&local_40,path);
  path_00 = ON_wString::operator_cast_to_wchar_t_(&local_40);
  local_28 = (wchar_t *)0x0;
  local_30 = (wchar_t *)0x0;
  local_38 = (wchar_t *)0x0;
  on_wsplitpath(path_00,&local_28,&local_30,&local_38,(wchar_t **)0x0);
  if (((local_38 < path_00) || (path_00 == (wchar_t *)0x0)) || (local_38 == (wchar_t *)0x0)) {
    length = ON_wString::Length(&local_40);
  }
  else {
    length = (int)((ulong)((long)local_38 - (long)path_00) >> 2);
  }
  if (file_name != (ON_wString *)0x0) {
    ON_wString::operator=(file_name,local_38);
  }
  ON_wString::ON_wString((ON_wString *)this,path_00,length);
  ON_wString::~ON_wString(&local_40);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_FileSystemPath::RemoveFileName(
  const wchar_t* path,
  ON_wString* file_name
)
{
  const ON_wString local_path = ON_FileSystemPath::CleanPath(path);
  path = static_cast<const wchar_t*>(local_path);
  const wchar_t* vol = nullptr;
  const wchar_t* dir = nullptr;
  const wchar_t* fname = nullptr;
  on_wsplitpath(path, &vol, &dir, &fname, nullptr);
  
  const size_t length
    = (nullptr != fname && nullptr != path && path <= fname)
    ? (int)(fname - path)
    : local_path.Length();

  if (nullptr != file_name)
    *file_name = fname;

  return ON_wString(path,(int)length);
}